

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O1

MPP_RET vp8d_parser_parse(void *ctx,HalDecTask *in_task)

{
  vpBoolCoder_t *pvVar1;
  RK_S8 *pRVar2;
  VP8Frame **ppVVar3;
  VP8Frame **ppVVar4;
  VP8Frame **ppVVar5;
  VP8DParserContext_t *p;
  RK_U8 *pRVar6;
  DXVA_PicParams_VP8 *pDVar7;
  RK_U32 RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  vp8EntropyProbs_t *pvVar14;
  RK_S8 RVar15;
  RK_U8 RVar16;
  uint uVar17;
  RK_U32 RVar18;
  vpColorSpace_e vVar19;
  RK_S32 RVar20;
  int iVar21;
  MPP_RET MVar22;
  RK_U8 (*paRVar23) [19];
  VP8Frame *pVVar24;
  long lVar25;
  FILE *pFVar26;
  byte bVar27;
  byte bVar28;
  ulong uVar29;
  byte bVar30;
  byte bVar31;
  uint uVar32;
  int iVar33;
  char *pcVar34;
  int iVar35;
  long lVar36;
  VP8Frame **ppVVar37;
  RK_U32 RVar38;
  uint3 *puVar39;
  undefined8 uVar40;
  byte *pbVar41;
  undefined4 *puVar42;
  RK_U8 (*paRVar43) [19];
  undefined8 uVar44;
  bool bVar45;
  char name [256];
  char local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  undefined4 local_130;
  
  p = *ctx;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x508,
               "vp8d_parser_parse");
  }
  pbVar41 = p->bitstream_sw_buf;
  RVar38 = p->stream_size;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x4a3,
               "decoder_frame_header");
  }
  bVar28 = *pbVar41;
  uVar17 = bVar28 & 1;
  p->keyFrame = uVar17 ^ 1;
  bVar27 = *pbVar41 >> 1 & 7;
  p->vpVersion = bVar27;
  p->showFrame = 1;
  if (((bVar28 & 1) == 0) && (p->needKeyFrame == 0)) {
    p->needKeyFrame = 1;
LAB_001b0eca:
    if (p->decMode == 1) {
      p->offsetToDctParts = (uint)pbVar41[2] << 0xc | (uint)pbVar41[1] << 4 | (uint)(*pbVar41 >> 4);
      uVar32 = (bVar27 == 0) + 3;
    }
    else {
      p->offsetToDctParts = (uint)pbVar41[2] << 0xb | (uint)(*pbVar41 >> 5) + (uint)pbVar41[1] * 8;
      p->showFrame = *pbVar41 >> 4 & 1;
      uVar32 = 3;
    }
    p->frameTagSize = uVar32;
    if ((char)uVar17 == '\0') {
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x2f1,
                   "vp8hwdResetProbs");
      }
      p->vp7ScanOrder[0xc] = 7;
      p->vp7ScanOrder[0xd] = 0xb;
      p->vp7ScanOrder[0xe] = 0xe;
      p->vp7ScanOrder[0xf] = 0xf;
      p->vp7ScanOrder[8] = 9;
      p->vp7ScanOrder[9] = 0xc;
      p->vp7ScanOrder[10] = 0xd;
      p->vp7ScanOrder[0xb] = 10;
      p->vp7ScanOrder[4] = 5;
      p->vp7ScanOrder[5] = 2;
      p->vp7ScanOrder[6] = 3;
      p->vp7ScanOrder[7] = 6;
      p->vp7ScanOrder[0] = 0;
      p->vp7ScanOrder[1] = 1;
      p->vp7ScanOrder[2] = 4;
      p->vp7ScanOrder[3] = 8;
      (p->entropy).probLuma16x16PredMode[0] = 'p';
      (p->entropy).probLuma16x16PredMode[1] = 'V';
      (p->entropy).probLuma16x16PredMode[2] = 0x8c;
      (p->entropy).probLuma16x16PredMode[3] = '%';
      (p->entropy).probChromaPredMode[0] = 0xa2;
      (p->entropy).probChromaPredMode[1] = 'e';
      (p->entropy).probChromaPredMode[2] = 0xcc;
      p->mbRefLfDelta[0] = 0;
      p->mbRefLfDelta[1] = 0;
      p->mbRefLfDelta[2] = 0;
      p->mbRefLfDelta[3] = 0;
      p->mbModeLfDelta[0] = 0;
      p->mbModeLfDelta[1] = 0;
      p->mbModeLfDelta[2] = 0;
      p->mbModeLfDelta[3] = 0;
      paRVar23 = (p->entropy).probMvContext;
      if (p->decMode == 2) {
        *(undefined8 *)((p->entropy).probMvContext[0] + 0x10) = 0x77aacc80a4fefeef;
        paRVar43 = (p->entropy).probMvContext;
        *(RK_U8 *)((long)(paRVar43 + 1) + 5) = 0xeb;
        *(RK_U8 *)((long)(paRVar43 + 1) + 6) = 0x8c;
        *(RK_U8 *)((long)(paRVar43 + 1) + 7) = 0xe6;
        *(RK_U8 *)((long)(paRVar43 + 1) + 8) = 0xe4;
        *(RK_U8 *)((long)(paRVar43 + 1) + 9) = 0x80;
        *(RK_U8 *)((long)(paRVar43 + 1) + 10) = 0x82;
        *(RK_U8 *)((long)(paRVar43 + 1) + 0xb) = 0x82;
        *(RK_U8 *)((long)(paRVar43 + 1) + 0xc) = 'J';
        *(RK_U8 *)((long)paRVar23 + 0) = 0xa2;
        *(RK_U8 *)((long)paRVar23 + 1) = 0x80;
        *(RK_U8 *)((long)paRVar23 + 2) = 0xe1;
        *(RK_U8 *)((long)paRVar23 + 3) = 0x92;
        *(RK_U8 *)((long)paRVar23 + 4) = 0xac;
        *(RK_U8 *)((long)paRVar23 + 5) = 0x93;
        *(RK_U8 *)((long)paRVar23 + 6) = 0xd6;
        *(RK_U8 *)((long)paRVar23 + 7) = '\'';
        pvVar14 = &p->entropy;
        *(RK_U8 *)((long)(pvVar14->probMvContext + 0) + 8) = 0x9c;
        *(RK_U8 *)((long)(pvVar14->probMvContext + 0) + 9) = 0x80;
        *(RK_U8 *)((long)(pvVar14->probMvContext + 0) + 10) = 0x81;
        *(RK_U8 *)((long)(pvVar14->probMvContext + 0) + 0xb) = 0x84;
        *(RK_U8 *)((long)(pvVar14->probMvContext + 0) + 0xc) = 'K';
        *(RK_U8 *)((long)(pvVar14->probMvContext + 0) + 0xd) = 0x91;
        *(RK_U8 *)((long)(pvVar14->probMvContext + 0) + 0xe) = 0xb2;
        *(RK_U8 *)((long)(pvVar14->probMvContext + 0) + 0xf) = 0xce;
        paRVar23 = (p->entropy).probMvContext;
        *(RK_U8 *)((long)(paRVar23 + 1) + 0xb) = 0x82;
        *(RK_U8 *)((long)(paRVar23 + 1) + 0xc) = 'J';
        *(RK_U8 *)((long)(paRVar23 + 1) + 0xd) = 0x94;
        *(RK_U8 *)((long)(paRVar23 + 1) + 0xe) = 0xb4;
        *(RK_U8 *)((long)(paRVar23 + 1) + 0xf) = 0xcb;
        *(RK_U8 *)((long)(paRVar23 + 1) + 0x10) = 0xec;
        *(RK_U8 *)((long)(paRVar23 + 1) + 0x11) = 0xfe;
        *(RK_U8 *)((long)(paRVar23 + 1) + 0x12) = 0xfe;
      }
      else {
        lVar25 = 0;
        do {
          (*paRVar23)[0x10] = Vp7DefaultMvProbs[0][lVar25 + 0x10];
          uVar44 = *(undefined8 *)(Vp7DefaultMvProbs[0] + lVar25 + 8);
          *(undefined8 *)*paRVar23 = *(undefined8 *)(Vp7DefaultMvProbs[0] + lVar25);
          *(undefined8 *)(*paRVar23 + 8) = uVar44;
          lVar25 = lVar25 + 0x11;
          paRVar23 = paRVar23 + 1;
        } while (lVar25 != 0x22);
      }
      memcpy((p->entropy).probCoeffs,DefaultCoeffProbs,0x420);
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x319,
                   "vp8hwdResetProbs");
      }
    }
    pbVar41 = pbVar41 + uVar32;
    RVar38 = RVar38 - uVar32;
    if (p->decMode == 2) {
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x337,
                   "vp8_header_parser");
      }
      if (p->keyFrame != 0) {
        if (((uint)pbVar41[2] | (uint)pbVar41[1] << 8 | (uint)*pbVar41 << 0x10) != 0x9d012a) {
          uVar44 = 0xfffffc11;
          bVar45 = false;
          goto LAB_001b1ecf;
        }
        bVar28 = pbVar41[4];
        uVar17 = (bVar28 & 0x3f) << 8 | (uint)pbVar41[3];
        p->width = uVar17;
        RVar18 = ScaleDimension(uVar17,(uint)(bVar28 >> 6));
        p->scaledWidth = RVar18;
        bVar28 = pbVar41[6];
        uVar17 = (bVar28 & 0x3f) << 8 | (uint)pbVar41[5];
        p->height = uVar17;
        RVar18 = ScaleDimension(uVar17,(uint)(bVar28 >> 6));
        p->scaledHeight = RVar18;
        pbVar41 = pbVar41 + 7;
        RVar38 = RVar38 - 7;
      }
      pvVar1 = &p->bitstr;
      vp8hwdBoolStart(pvVar1,pbVar41,RVar38);
      if (p->keyFrame != 0) {
        vVar19 = vp8hwdDecodeBool128(pvVar1);
        p->colorSpace = vVar19;
        RVar38 = vp8hwdDecodeBool128(pvVar1);
        p->clamping = RVar38;
      }
      RVar38 = vp8hwdDecodeBool128(pvVar1);
      p->segmentationEnabled = RVar38;
      p->segmentationMapUpdate = 0;
      if (RVar38 != 0) {
        RVar38 = vp8hwdDecodeBool128(pvVar1);
        p->segmentationMapUpdate = RVar38;
        RVar38 = vp8hwdDecodeBool128(pvVar1);
        if (RVar38 != 0) {
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          p->segmentFeatureMode = RVar38;
          p->segmentQp[0] = 0;
          p->segmentQp[1] = 0;
          p->segmentQp[2] = 0;
          p->segmentQp[3] = 0;
          p->segmentLoopfilter[0] = 0;
          p->segmentLoopfilter[1] = 0;
          p->segmentLoopfilter[2] = 0;
          p->segmentLoopfilter[3] = 0;
          lVar25 = 0;
          do {
            RVar38 = vp8hwdDecodeBool128(pvVar1);
            if (RVar38 != 0) {
              RVar38 = vp8hwdReadBits(pvVar1,7);
              p->segmentQp[lVar25] = RVar38;
              RVar38 = vp8hwdDecodeBool128(pvVar1);
              if (RVar38 != 0) {
                p->segmentQp[lVar25] = -p->segmentQp[lVar25];
              }
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != 4);
          lVar25 = 0;
          do {
            RVar38 = vp8hwdDecodeBool128(pvVar1);
            if (RVar38 != 0) {
              RVar38 = vp8hwdReadBits(pvVar1,6);
              p->segmentLoopfilter[lVar25] = RVar38;
              RVar38 = vp8hwdDecodeBool128(pvVar1);
              if (RVar38 != 0) {
                p->segmentLoopfilter[lVar25] = -p->segmentLoopfilter[lVar25];
              }
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != 4);
        }
        if (p->segmentationMapUpdate != 0) {
          p->probSegment[0] = 0xff;
          p->probSegment[1] = 0xff;
          p->probSegment[2] = 0xff;
          lVar25 = 0;
          do {
            RVar38 = vp8hwdDecodeBool128(pvVar1);
            if (RVar38 != 0) {
              RVar38 = vp8hwdReadBits(pvVar1,8);
              p->probSegment[lVar25] = RVar38;
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != 3);
        }
        if ((p->bitstr).strmError != 0) {
          bVar45 = false;
          _mpp_log_l(2,"vp8d_parser","paser header stream no enough","vp8_header_parser");
          uVar44 = 0xfffffc14;
          if ((vp8d_debug & 1) != 0) {
            pcVar34 = "vp8_header_parser";
            bVar45 = false;
            uVar40 = 0x36e;
            goto LAB_001b1ec8;
          }
          goto LAB_001b1ecf;
        }
      }
      RVar38 = vp8hwdDecodeBool128(pvVar1);
      p->loopFilterType = RVar38;
      RVar38 = vp8hwdReadBits(pvVar1,6);
      p->loopFilterLevel = RVar38;
      RVar38 = vp8hwdReadBits(pvVar1,3);
      p->loopFilterSharpness = RVar38;
      RVar38 = vp8hwdDecodeBool128(pvVar1);
      p->modeRefLfEnabled = RVar38;
      if ((RVar38 != 0) && (RVar38 = vp8hwdDecodeBool128(pvVar1), RVar38 != 0)) {
        lVar25 = 0;
        do {
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          if (RVar38 != 0) {
            RVar38 = vp8hwdReadBits(pvVar1,6);
            p->mbRefLfDelta[lVar25] = RVar38;
            RVar38 = vp8hwdDecodeBool128(pvVar1);
            if (RVar38 != 0) {
              p->mbRefLfDelta[lVar25] = -p->mbRefLfDelta[lVar25];
            }
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        lVar25 = 0;
        do {
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          if (RVar38 != 0) {
            RVar38 = vp8hwdReadBits(pvVar1,6);
            p->mbModeLfDelta[lVar25] = RVar38;
            RVar38 = vp8hwdDecodeBool128(pvVar1);
            if (RVar38 != 0) {
              p->mbModeLfDelta[lVar25] = -p->mbModeLfDelta[lVar25];
            }
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
      }
      if ((p->bitstr).strmError == 0) {
        RVar38 = vp8hwdReadBits(pvVar1,2);
        p->nbrDctPartitions = RVar38;
        RVar38 = vp8hwdReadBits(pvVar1,7);
        p->qpYAc = (RK_S8)RVar38;
        RVar20 = DecodeQuantizerDelta(pvVar1);
        p->qpYDc = (RK_S8)RVar20;
        RVar20 = DecodeQuantizerDelta(pvVar1);
        p->qpY2Dc = (RK_S8)RVar20;
        RVar20 = DecodeQuantizerDelta(pvVar1);
        p->qpY2Ac = (RK_S8)RVar20;
        RVar20 = DecodeQuantizerDelta(pvVar1);
        p->qpChDc = (RK_S8)RVar20;
        RVar20 = DecodeQuantizerDelta(pvVar1);
        p->qpChAc = (RK_S8)RVar20;
        if (p->keyFrame == 0) {
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          p->refreshGolden = RVar38;
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          p->refreshAlternate = RVar38;
          RVar18 = 0;
          RVar38 = 0;
          if (p->refreshGolden == 0) {
            RVar38 = vp8hwdReadBits(pvVar1,2);
          }
          p->copyBufferToGolden = RVar38;
          if (p->refreshAlternate == 0) {
            RVar18 = vp8hwdReadBits(pvVar1,2);
          }
          p->copyBufferToAlternate = RVar18;
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          p->refFrameSignBias[0] = RVar38;
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          p->refFrameSignBias[1] = RVar38;
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          p->refreshEntropyProbs = RVar38;
          RVar38 = vp8hwdDecodeBool128(pvVar1);
        }
        else {
          p->refreshGolden = 1;
          p->refreshAlternate = 1;
          p->copyBufferToGolden = 0;
          p->copyBufferToAlternate = 0;
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          p->refreshEntropyProbs = RVar38;
          p->refFrameSignBias[0] = 0;
          p->refFrameSignBias[1] = 0;
          RVar38 = 1;
        }
        p->refreshLast = RVar38;
        if (p->refreshEntropyProbs == 0) {
          memcpy(&p->entropyLast,&p->entropy,0x44d);
          uVar44 = *(undefined8 *)(p->vp7ScanOrder + 2);
          uVar40 = *(undefined8 *)(p->vp7ScanOrder + 4);
          uVar9 = *(undefined8 *)(p->vp7ScanOrder + 6);
          uVar10 = *(undefined8 *)(p->vp7ScanOrder + 8);
          uVar11 = *(undefined8 *)(p->vp7ScanOrder + 10);
          uVar12 = *(undefined8 *)(p->vp7ScanOrder + 0xc);
          uVar13 = *(undefined8 *)(p->vp7ScanOrder + 0xe);
          *(undefined8 *)p->vp7PrevScanOrder = *(undefined8 *)p->vp7ScanOrder;
          *(undefined8 *)(p->vp7PrevScanOrder + 2) = uVar44;
          *(undefined8 *)(p->vp7PrevScanOrder + 4) = uVar40;
          *(undefined8 *)(p->vp7PrevScanOrder + 6) = uVar9;
          *(undefined8 *)(p->vp7PrevScanOrder + 8) = uVar10;
          *(undefined8 *)(p->vp7PrevScanOrder + 10) = uVar11;
          *(undefined8 *)(p->vp7PrevScanOrder + 0xc) = uVar12;
          *(undefined8 *)(p->vp7PrevScanOrder + 0xe) = uVar13;
        }
        vp8hwdDecodeCoeffUpdate(p);
        RVar38 = vp8hwdDecodeBool128(pvVar1);
        p->coeffSkipMode = (RK_U8)RVar38;
        if (p->keyFrame == 0) {
          if (RVar38 != 0) {
            RVar38 = vp8hwdReadBits(pvVar1,8);
            p->probMbSkipFalse = RVar38;
          }
          RVar38 = vp8hwdReadBits(pvVar1,8);
          p->probIntra = RVar38;
          RVar38 = vp8hwdReadBits(pvVar1,8);
          p->probRefLast = RVar38;
          RVar38 = vp8hwdReadBits(pvVar1,8);
          p->probRefGolden = RVar38;
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          if (RVar38 != 0) {
            lVar25 = 0;
            do {
              RVar38 = vp8hwdReadBits(pvVar1,8);
              (p->entropy).probLuma16x16PredMode[lVar25] = (RK_U8)RVar38;
              lVar25 = lVar25 + 1;
            } while (lVar25 != 4);
          }
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          if (RVar38 != 0) {
            lVar25 = -3;
            do {
              RVar38 = vp8hwdReadBits(pvVar1,8);
              (p->entropy).probMvContext[0][lVar25] = (RK_U8)RVar38;
              lVar25 = lVar25 + 1;
            } while (lVar25 != 0);
          }
          paRVar23 = (p->entropy).probMvContext;
          paRVar43 = MvUpdateProbs;
          lVar25 = 0;
          do {
            lVar36 = 0;
            do {
              RVar38 = vp8hwdDecodeBool(pvVar1,(uint)(*paRVar43)[lVar36]);
              if (RVar38 != 0) {
                RVar38 = vp8hwdReadBits(pvVar1,7);
                RVar16 = (char)RVar38 * '\x02';
                if (RVar38 == 0) {
                  RVar16 = '\x01';
                }
                (*paRVar23)[lVar36] = RVar16;
              }
              lVar36 = lVar36 + 1;
            } while (lVar36 != 0x13);
            paRVar23 = paRVar23 + 1;
            paRVar43 = paRVar43 + 1;
            bVar45 = lVar25 == 0;
            lVar25 = lVar25 + 1;
          } while (bVar45);
        }
        else if (RVar38 != 0) {
          RVar38 = vp8hwdReadBits(pvVar1,8);
          p->probMbSkipFalse = RVar38;
        }
        if ((p->bitstr).strmError == 0) {
          bVar45 = true;
          if ((vp8d_debug & 1) != 0) {
            pcVar34 = "vp8_header_parser";
            uVar44 = 0;
            uVar40 = 0x3ea;
            goto LAB_001b1ec8;
          }
LAB_001b1e93:
          bVar45 = true;
          uVar44 = 0;
        }
        else {
          bVar45 = false;
          _mpp_log_l(2,"vp8d_parser","paser header stream no enough","vp8_header_parser");
          uVar44 = 0xfffffc14;
          if ((vp8d_debug & 1) != 0) {
            pcVar34 = "vp8_header_parser";
            bVar45 = false;
            uVar40 = 999;
LAB_001b1ec8:
            _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",uVar40,pcVar34
                      );
          }
        }
      }
      else {
        bVar45 = false;
        _mpp_log_l(2,"vp8d_parser","paser header stream no enough","vp8_header_parser");
        uVar44 = 0xfffffc14;
        if ((vp8d_debug & 1) != 0) {
          pcVar34 = "vp8_header_parser";
          bVar45 = false;
          uVar40 = 0x38a;
          goto LAB_001b1ec8;
        }
      }
    }
    else {
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x3f4,
                   "vp7_header_parser");
      }
      pvVar1 = &p->bitstr;
      vp8hwdBoolStart(pvVar1,pbVar41,RVar38);
      if (p->keyFrame != 0) {
        RVar38 = vp8hwdReadBits(pvVar1,0xc);
        p->width = RVar38;
        RVar38 = vp8hwdReadBits(pvVar1,0xc);
        p->height = RVar38;
        RVar38 = vp8hwdReadBits(pvVar1,2);
        RVar38 = ScaleDimension(p->width,RVar38);
        p->scaledWidth = RVar38;
        RVar38 = vp8hwdReadBits(pvVar1,2);
        RVar38 = ScaleDimension(p->height,RVar38);
        p->scaledHeight = RVar38;
      }
      puVar42 = (undefined4 *)&DAT_0028ce60;
      if (p->vpVersion == '\0') {
        puVar42 = &DAT_0028ce50;
      }
      RVar38 = vp8hwdDecodeBool128(pvVar1);
      if (RVar38 == 0) {
        lVar25 = 0;
        do {
          uVar17 = (uint)lVar25;
          if (uVar17 == 3) {
            p->nbrDctPartitions = 0;
            goto LAB_001b167b;
          }
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          lVar25 = lVar25 + 1;
        } while (RVar38 == 0);
        bVar45 = 2 < uVar17;
      }
      else {
        bVar45 = false;
        lVar25 = 0;
      }
      vp8hwdReadBits(pvVar1,8);
      iVar35 = 3;
      do {
        RVar38 = vp8hwdDecodeBool128(pvVar1);
        if (RVar38 != 0) {
          vp8hwdReadBits(pvVar1,8);
        }
        iVar35 = iVar35 + -1;
      } while (iVar35 != 0);
      RVar20 = puVar42[lVar25];
      if (RVar20 != 0) {
        iVar35 = 4;
        do {
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          if (RVar38 != 0) {
            vp8hwdReadBits(pvVar1,RVar20);
          }
          iVar35 = iVar35 + -1;
        } while (iVar35 != 0);
      }
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x415,
                   "vp7_header_parser");
      }
      if (bVar45) {
LAB_001b167b:
        RVar38 = vp8hwdReadBits(pvVar1,7);
        p->qpYAc = (RK_S8)RVar38;
        RVar38 = vp8hwdReadBits(pvVar1,1);
        if (RVar38 == 0) {
          RVar15 = p->qpYAc;
        }
        else {
          RVar38 = vp8hwdReadBits(pvVar1,7);
          RVar15 = (RK_S8)RVar38;
        }
        p->qpYDc = RVar15;
        RVar38 = vp8hwdReadBits(pvVar1,1);
        if (RVar38 == 0) {
          RVar15 = p->qpYAc;
        }
        else {
          RVar38 = vp8hwdReadBits(pvVar1,7);
          RVar15 = (RK_S8)RVar38;
        }
        p->qpY2Dc = RVar15;
        RVar38 = vp8hwdReadBits(pvVar1,1);
        if (RVar38 == 0) {
          RVar15 = p->qpYAc;
        }
        else {
          RVar38 = vp8hwdReadBits(pvVar1,7);
          RVar15 = (RK_S8)RVar38;
        }
        p->qpY2Ac = RVar15;
        RVar38 = vp8hwdReadBits(pvVar1,1);
        if (RVar38 == 0) {
          RVar15 = p->qpYAc;
        }
        else {
          RVar38 = vp8hwdReadBits(pvVar1,7);
          RVar15 = (RK_S8)RVar38;
        }
        p->qpChDc = RVar15;
        RVar38 = vp8hwdReadBits(pvVar1,1);
        if (RVar38 == 0) {
          RVar15 = p->qpYAc;
        }
        else {
          RVar38 = vp8hwdReadBits(pvVar1,7);
          RVar15 = (RK_S8)RVar38;
        }
        p->qpChAc = RVar15;
        if (p->keyFrame == 0) {
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          p->refreshGolden = RVar38;
          if (p->vpVersion == '\0') {
            p->refreshEntropyProbs = 1;
            RVar38 = 1;
          }
          else {
            RVar38 = vp8hwdDecodeBool128(pvVar1);
            p->refreshEntropyProbs = RVar38;
            RVar38 = vp8hwdDecodeBool128(pvVar1);
          }
        }
        else {
          p->refreshGolden = 1;
          p->refreshAlternate = 1;
          p->copyBufferToGolden = 0;
          p->copyBufferToAlternate = 0;
          RVar38 = 1;
          RVar18 = 1;
          if (p->vpVersion != '\0') {
            RVar18 = vp8hwdDecodeBool128(pvVar1);
          }
          p->refreshEntropyProbs = RVar18;
          p->refFrameSignBias[0] = 0;
          p->refFrameSignBias[1] = 0;
        }
        p->refreshLast = RVar38;
        if (p->refreshEntropyProbs == 0) {
          memcpy(&p->entropyLast,&p->entropy,0x44d);
          uVar44 = *(undefined8 *)(p->vp7ScanOrder + 2);
          uVar40 = *(undefined8 *)(p->vp7ScanOrder + 4);
          uVar9 = *(undefined8 *)(p->vp7ScanOrder + 6);
          uVar10 = *(undefined8 *)(p->vp7ScanOrder + 8);
          uVar11 = *(undefined8 *)(p->vp7ScanOrder + 10);
          uVar12 = *(undefined8 *)(p->vp7ScanOrder + 0xc);
          uVar13 = *(undefined8 *)(p->vp7ScanOrder + 0xe);
          *(undefined8 *)p->vp7PrevScanOrder = *(undefined8 *)p->vp7ScanOrder;
          *(undefined8 *)(p->vp7PrevScanOrder + 2) = uVar44;
          *(undefined8 *)(p->vp7PrevScanOrder + 4) = uVar40;
          *(undefined8 *)(p->vp7PrevScanOrder + 6) = uVar9;
          *(undefined8 *)(p->vp7PrevScanOrder + 8) = uVar10;
          *(undefined8 *)(p->vp7PrevScanOrder + 10) = uVar11;
          *(undefined8 *)(p->vp7PrevScanOrder + 0xc) = uVar12;
          *(undefined8 *)(p->vp7PrevScanOrder + 0xe) = uVar13;
        }
        if ((p->refreshLast == 0) || (RVar38 = vp8hwdDecodeBool128(pvVar1), RVar38 == 0)) {
          if (p->vpVersion == '\0') {
            RVar38 = vp8hwdDecodeBool128(pvVar1);
            p->loopFilterType = RVar38;
          }
          RVar38 = vp8hwdDecodeBool128(pvVar1);
          if (RVar38 != 0) {
            p->vp7ScanOrder[0] = 0;
            lVar25 = 0;
            do {
              RVar38 = vp8hwdReadBits(pvVar1,4);
              p->vp7ScanOrder[lVar25 + 1] =
                   *(RK_U32 *)(vp7_header_parser_Vp7DefaultScan + (ulong)RVar38 * 4);
              lVar25 = lVar25 + 1;
            } while (lVar25 != 0xf);
          }
          if (p->vpVersion != '\0') {
            RVar38 = vp8hwdDecodeBool128(pvVar1);
            p->loopFilterType = RVar38;
          }
          RVar38 = vp8hwdReadBits(pvVar1,6);
          p->loopFilterLevel = RVar38;
          RVar38 = vp8hwdReadBits(pvVar1,3);
          p->loopFilterSharpness = RVar38;
          vp8hwdDecodeCoeffUpdate(p);
          if (p->keyFrame == 0) {
            RVar38 = vp8hwdReadBits(pvVar1,8);
            p->probIntra = RVar38;
            RVar38 = vp8hwdReadBits(pvVar1,8);
            p->probRefLast = RVar38;
            RVar38 = vp8hwdDecodeBool128(pvVar1);
            if (RVar38 != 0) {
              lVar25 = 0;
              do {
                RVar38 = vp8hwdReadBits(pvVar1,8);
                (p->entropy).probLuma16x16PredMode[lVar25] = (RK_U8)RVar38;
                lVar25 = lVar25 + 1;
              } while (lVar25 != 4);
            }
            RVar38 = vp8hwdDecodeBool128(pvVar1);
            if (RVar38 != 0) {
              lVar25 = -3;
              do {
                RVar38 = vp8hwdReadBits(pvVar1,8);
                (p->entropy).probMvContext[0][lVar25] = (RK_U8)RVar38;
                lVar25 = lVar25 + 1;
              } while (lVar25 != 0);
            }
            paRVar23 = (p->entropy).probMvContext;
            paRVar43 = MvUpdateProbs;
            lVar25 = 0;
            do {
              lVar36 = 0;
              do {
                RVar38 = vp8hwdDecodeBool(pvVar1,(uint)(*paRVar43)[lVar36]);
                if (RVar38 != 0) {
                  RVar38 = vp8hwdReadBits(pvVar1,7);
                  RVar16 = (char)RVar38 * '\x02';
                  if (RVar38 == 0) {
                    RVar16 = '\x01';
                  }
                  (*paRVar23)[lVar36] = RVar16;
                }
                lVar36 = lVar36 + 1;
              } while (lVar36 != 0x11);
              paRVar23 = paRVar23 + 1;
              paRVar43 = paRVar43 + 1;
              bVar45 = lVar25 == 0;
              lVar25 = lVar25 + 1;
            } while (bVar45);
          }
          if ((p->bitstr).strmError == 0) {
            bVar45 = true;
            if ((vp8d_debug & 1) == 0) goto LAB_001b1e93;
            pcVar34 = "vp7_header_parser";
            uVar44 = 0;
            uVar40 = 0x47b;
          }
          else {
            uVar44 = 0xfffffc11;
            if ((vp8d_debug & 1) == 0) goto LAB_001b1b4d;
            pcVar34 = "vp7_header_parser";
            bVar45 = false;
            uVar40 = 0x477;
          }
        }
        else {
          vp8hwdReadBits(pvVar1,8);
          vp8hwdReadBits(pvVar1,8);
          uVar44 = 0xfffffc14;
          if ((vp8d_debug & 1) == 0) goto LAB_001b1b4d;
          pcVar34 = "vp7_header_parser";
          bVar45 = false;
          uVar40 = 0x448;
        }
        goto LAB_001b1ec8;
      }
      uVar44 = 0xfffffc11;
LAB_001b1b4d:
      bVar45 = false;
    }
  }
  else {
    if (p->needKeyFrame != 0) goto LAB_001b0eca;
    bVar45 = false;
    _mpp_log_l(2,"vp8d_parser","no found key frame",(char *)0x0);
    uVar44 = 0xffffffff;
  }
LAB_001b1ecf:
  MVar22 = (MPP_RET)uVar44;
  if (!bVar45) {
    _mpp_log_l(2,"vp8d_parser","decoder_frame_header err ret %d",(char *)0x0,uVar44);
    uVar44 = 0x50e;
    goto LAB_001b29ed;
  }
  pRVar6 = p->bitstream_sw_buf;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x487,
               "vp8hwdSetPartitionOffsets");
  }
  iVar33 = 0;
  iVar35 = 0;
  if ((p->decMode == 2) && (iVar35 = 7, p->keyFrame == 0)) {
    iVar35 = 0;
  }
  bVar28 = (byte)p->nbrDctPartitions;
  iVar21 = (3 << (bVar28 & 0x1f)) + p->frameTagSize + p->offsetToDctParts + -3;
  if (p->nbrDctPartitions == 0) {
    uVar29 = 0;
  }
  else {
    uVar32 = -1 << (bVar28 & 0x1f);
    puVar39 = (uint3 *)(pRVar6 + (ulong)(p->offsetToDctParts + iVar35) + (ulong)p->frameTagSize);
    uVar17 = 0xfffffffe;
    if (uVar32 < 0xfffffffe) {
      uVar17 = uVar32;
    }
    uVar29 = 0;
    iVar33 = 0;
    do {
      p->dctPartitionOffsets[uVar29] = iVar33 + iVar21;
      iVar33 = (uint)*puVar39 + iVar33;
      puVar39 = (uint3 *)((long)puVar39 + 3);
      uVar29 = uVar29 + 1;
    } while (~uVar17 != uVar29);
  }
  p->dctPartitionOffsets[uVar29] = iVar33 + iVar21;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x25f,
               "vp8d_alloc_frame");
  }
  if (p->frame_out == (VP8Frame *)0x0) {
    pVVar24 = (VP8Frame *)mpp_osal_calloc("vp8d_alloc_frame",0x10);
    p->frame_out = pVVar24;
    if (pVVar24 == (VP8Frame *)0x0) {
      pcVar34 = "alloc vp8 frame fail";
    }
    else {
      if ((pVVar24->f != (MppFrame)0x0) ||
         (mpp_frame_init((MppFrame *)pVVar24), p->frame_out->f != (MppFrame)0x0)) {
        pVVar24 = p->frame_out;
        pVVar24->slot_index = 0xff;
        pVVar24->invisible = p->showFrame == 0;
        goto LAB_001b2075;
      }
      pcVar34 = "alloc vp8 mpp frame fail";
    }
    _mpp_log_l(2,"vp8d_parser",pcVar34,(char *)0x0);
    uVar29 = 0xfffffc12;
  }
  else {
LAB_001b2075:
    if (p->frame_out->slot_index == 0xff) {
      mpp_frame_set_width(p->frame_out->f,p->width);
      mpp_frame_set_height(p->frame_out->f,p->height);
      mpp_frame_set_hor_stride(p->frame_out->f,p->width);
      mpp_frame_set_ver_stride(p->frame_out->f,p->height);
      mpp_frame_set_errinfo(p->frame_out->f,0);
      mpp_frame_set_pts(p->frame_out->f,p->pts);
      MVar22 = mpp_buf_slot_get_unused(p->frame_slots,&p->frame_out->slot_index);
      if (MVar22 != MPP_OK) {
        uVar29 = (ulong)(uint)MVar22;
        _mpp_log_l(2,"vp8d_parser","vp8 buf_slot_get_unused get fail",(char *)0x0);
        goto LAB_001b221b;
      }
      mpp_buf_slot_set_prop(p->frame_slots,p->frame_out->slot_index,SLOT_FRAME,p->frame_out->f);
      mpp_buf_slot_set_flag(p->frame_slots,p->frame_out->slot_index,SLOT_CODEC_USE);
      mpp_buf_slot_set_flag(p->frame_slots,p->frame_out->slot_index,SLOT_HAL_OUTPUT);
      mpp_frame_set_mode(p->frame_out->f,0);
      if (p->showFrame != 0) {
        mpp_buf_slot_set_flag(p->frame_slots,p->frame_out->slot_index,SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(p->frame_slots,p->frame_out->slot_index,QUEUE_DISPLAY);
      }
      pRVar2 = &p->frame_out->ref_count;
      *pRVar2 = *pRVar2 + '\x01';
    }
    uVar29 = 0;
    if ((vp8d_debug & 1) != 0) {
      uVar29 = 0;
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x290,
                 "vp8d_alloc_frame");
    }
  }
LAB_001b221b:
  MVar22 = (MPP_RET)uVar29;
  if (MVar22 != MPP_OK) {
    _mpp_log_l(2,"vp8d_parser","vp8d_alloc_frame err ret %d",(char *)0x0,uVar29);
    uVar44 = 0x517;
    goto LAB_001b29ed;
  }
  pDVar7 = p->dxva_ctx;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x1ed,
               "vp8d_convert_to_syntx");
  }
  uVar17 = (p->bitstr).pos * 8 - (p->bitstr).count;
  iVar35 = 0;
  if ((p->decMode == 2) && (iVar35 = 0x38, p->keyFrame == 0)) {
    iVar35 = 0;
  }
  uVar32 = uVar17 + (uint)(p->frameTagSize == 4) * 8 + 8 + iVar35;
  pDVar7->stream_start_offset = uVar32 >> 3 & 0xfffffff8;
  pDVar7->stream_start_bit = uVar17 & 7 | uVar32 & 0x38;
  bVar45 = p->keyFrame == 0;
  bVar28 = (pDVar7->field_4).wFrameTagFlags;
  bVar27 = (pDVar7->stVP8Segments).field_0.wSegmentFlags;
  (pDVar7->field_4).wFrameTagFlags = bVar28 & 0xfe | bVar45;
  bVar30 = (byte)p->segmentationEnabled & 1;
  (pDVar7->stVP8Segments).field_0.wSegmentFlags = bVar27 & 0xfe | bVar30;
  bVar31 = (char)p->segmentationMapUpdate * '\x02' & 2;
  (pDVar7->stVP8Segments).field_0.wSegmentFlags = bVar27 & 0xfc | bVar30 | bVar31;
  pDVar7->mode_ref_lf_delta_enabled = (RK_U8)p->modeRefLfEnabled;
  pDVar7->mb_no_coeff_skip = p->coeffSkipMode;
  pDVar7->width = p->width;
  pDVar7->height = p->height;
  pDVar7->decMode = p->decMode;
  pDVar7->filter_type = (RK_U8)p->loopFilterType;
  pDVar7->sharpness = (RK_U8)p->loopFilterSharpness;
  pDVar7->filter_level = (RK_U8)p->loopFilterLevel;
  (pDVar7->stVP8Segments).field_0.wSegmentFlags =
       bVar27 & 0xf8 | bVar30 | bVar31 | ((byte)p->segmentFeatureMode & 1) << 2;
  (pDVar7->field_4).wFrameTagFlags = bVar28 & 0xf0 | bVar45 | p->vpVersion * '\x02' & 0xe;
  pDVar7->bool_value = (uint)*(byte *)((long)&(p->bitstr).value + 3);
  pDVar7->bool_range = (uint)(byte)(p->bitstr).range;
  pDVar7->frameTagSize = p->frameTagSize;
  pDVar7->streamEndPos = (p->bitstr).streamEndPos;
  pDVar7->log2_nbr_of_dct_partitions = (RK_U8)p->nbrDctPartitions;
  pDVar7->offsetToDctParts = p->offsetToDctParts;
  pDVar7->y1ac_delta_q = p->qpYAc;
  pDVar7->y1dc_delta_q = p->qpYDc;
  pDVar7->y2ac_delta_q = p->qpY2Ac;
  pDVar7->y2dc_delta_q = p->qpY2Dc;
  pDVar7->uvac_delta_q = p->qpChAc;
  pDVar7->uvdc_delta_q = p->qpChDc;
  pDVar7->probe_skip_false = (RK_U8)p->probMbSkipFalse;
  pDVar7->prob_intra = (RK_U8)p->probIntra;
  pDVar7->prob_last = (RK_U8)p->probRefLast;
  pDVar7->prob_golden = (RK_U8)p->probRefGolden;
  memcpy(pDVar7->vp8_coef_update_probs,(p->entropy).probCoeffs,0x420);
  uVar44 = *(undefined8 *)((p->entropy).probMvContext[0] + 8);
  uVar40 = *(undefined8 *)((p->entropy).probMvContext[0] + 0x10);
  uVar9 = *(undefined8 *)((p->entropy).probMvContext[1] + 5);
  *(undefined8 *)pDVar7->vp8_mv_update_probs[0] = *(undefined8 *)(p->entropy).probMvContext[0];
  *(undefined8 *)(pDVar7->vp8_mv_update_probs[0] + 8) = uVar44;
  *(undefined8 *)(pDVar7->vp8_mv_update_probs[0] + 0x10) = uVar40;
  *(undefined8 *)(pDVar7->vp8_mv_update_probs[1] + 5) = uVar9;
  *(undefined8 *)(pDVar7->vp8_mv_update_probs[1] + 0xb) =
       *(undefined8 *)((p->entropy).probMvContext[1] + 0xb);
  lVar25 = -3;
  do {
    pDVar7->vp8_mv_update_probs[0][lVar25] = (p->entropy).probMvContext[0][lVar25];
    pDVar7->ref_lf_deltas[lVar25 + -5] = (p->entropy).probLuma16x16PredMode[lVar25 * 4];
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0);
  pDVar7->ref_frame_sign_bias_golden = (RK_U8)p->refFrameSignBias[0];
  pDVar7->ref_frame_sign_bias_altref = (RK_U8)p->refFrameSignBias[1];
  lVar25 = 0;
  do {
    (pDVar7->stVP8Segments).segment_feature_data[0][lVar25] = (RK_S8)p->segmentQp[lVar25];
    pDVar7->ref_lf_deltas[lVar25] = (RK_S8)p->mbRefLfDelta[lVar25];
    pDVar7->mode_lf_deltas[lVar25] = (RK_S8)p->mbModeLfDelta[lVar25];
    (pDVar7->stVP8Segments).segment_feature_data[1][lVar25] = (RK_S8)p->segmentLoopfilter[lVar25];
    pDVar7->intra_16x16_prob[lVar25] = (p->entropy).probLuma16x16PredMode[lVar25];
    lVar25 = lVar25 + 1;
  } while (lVar25 != 4);
  (p->dxva_ctx->CurrPic).field_0.bPicEntry =
       (p->dxva_ctx->CurrPic).field_0.bPicEntry & 0x80 | (byte)p->frame_out->slot_index & 0x7f;
  in_task->refer[0xc] = -1;
  in_task->refer[0xd] = -1;
  in_task->refer[0xe] = -1;
  in_task->refer[0xf] = -1;
  in_task->refer[8] = -1;
  in_task->refer[9] = -1;
  in_task->refer[10] = -1;
  in_task->refer[0xb] = -1;
  in_task->refer[4] = -1;
  in_task->refer[5] = -1;
  in_task->refer[6] = -1;
  in_task->refer[7] = -1;
  in_task->refer[0] = -1;
  in_task->refer[1] = -1;
  in_task->refer[2] = -1;
  in_task->refer[3] = -1;
  in_task->refer[0x10] = -1;
  if (p->frame_ref == (VP8Frame *)0x0) {
    (pDVar7->lst_fb_idx).field_0.bPicEntry = (pDVar7->lst_fb_idx).field_0.bPicEntry | 0x7f;
  }
  else {
    (pDVar7->lst_fb_idx).field_0.bPicEntry =
         (pDVar7->lst_fb_idx).field_0.bPicEntry & 0x80 | (byte)p->frame_ref->slot_index & 0x7f;
    mpp_buf_slot_set_flag(p->frame_slots,p->frame_ref->slot_index,SLOT_HAL_INPUT);
    in_task->refer[0] = p->frame_ref->slot_index;
  }
  if (p->frame_golden == (VP8Frame *)0x0) {
    (pDVar7->gld_fb_idx).field_0.bPicEntry = (pDVar7->gld_fb_idx).field_0.bPicEntry | 0x7f;
  }
  else {
    (pDVar7->gld_fb_idx).field_0.bPicEntry =
         (pDVar7->gld_fb_idx).field_0.bPicEntry & 0x80 | (byte)p->frame_golden->slot_index & 0x7f;
    mpp_buf_slot_set_flag(p->frame_slots,p->frame_golden->slot_index,SLOT_HAL_INPUT);
    in_task->refer[1] = p->frame_golden->slot_index;
  }
  if (p->frame_alternate == (VP8Frame *)0x0) {
    (pDVar7->alt_fb_idx).field_0.bPicEntry = (pDVar7->alt_fb_idx).field_0.bPicEntry | 0x7f;
  }
  else {
    (pDVar7->alt_fb_idx).field_0.bPicEntry =
         (pDVar7->alt_fb_idx).field_0.bPicEntry & 0x80 | (byte)p->frame_alternate->slot_index & 0x7f
    ;
    mpp_buf_slot_set_flag(p->frame_slots,p->frame_alternate->slot_index,SLOT_HAL_INPUT);
    in_task->refer[2] = p->frame_alternate->slot_index;
  }
  uVar44 = *(undefined8 *)p->dctPartitionOffsets;
  uVar40 = *(undefined8 *)(p->dctPartitionOffsets + 2);
  RVar38 = p->dctPartitionOffsets[5];
  RVar18 = p->dctPartitionOffsets[6];
  RVar8 = p->dctPartitionOffsets[7];
  pDVar7->dctPartitionOffsets[4] = p->dctPartitionOffsets[4];
  pDVar7->dctPartitionOffsets[5] = RVar38;
  pDVar7->dctPartitionOffsets[6] = RVar18;
  pDVar7->dctPartitionOffsets[7] = RVar8;
  *(undefined8 *)pDVar7->dctPartitionOffsets = uVar44;
  *(undefined8 *)(pDVar7->dctPartitionOffsets + 2) = uVar40;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",599,
               "vp8d_convert_to_syntx");
  }
  if (p->refreshEntropyProbs == 0) {
    memcpy(&p->entropy,&p->entropyLast,0x44d);
    uVar44 = *(undefined8 *)(p->vp7PrevScanOrder + 2);
    uVar40 = *(undefined8 *)(p->vp7PrevScanOrder + 4);
    uVar9 = *(undefined8 *)(p->vp7PrevScanOrder + 6);
    uVar10 = *(undefined8 *)(p->vp7PrevScanOrder + 8);
    uVar11 = *(undefined8 *)(p->vp7PrevScanOrder + 10);
    uVar12 = *(undefined8 *)(p->vp7PrevScanOrder + 0xc);
    uVar13 = *(undefined8 *)(p->vp7PrevScanOrder + 0xe);
    *(undefined8 *)p->vp7ScanOrder = *(undefined8 *)p->vp7PrevScanOrder;
    *(undefined8 *)(p->vp7ScanOrder + 2) = uVar44;
    *(undefined8 *)(p->vp7ScanOrder + 4) = uVar40;
    *(undefined8 *)(p->vp7ScanOrder + 6) = uVar9;
    *(undefined8 *)(p->vp7ScanOrder + 8) = uVar10;
    *(undefined8 *)(p->vp7ScanOrder + 10) = uVar11;
    *(undefined8 *)(p->vp7ScanOrder + 0xc) = uVar12;
    *(undefined8 *)(p->vp7ScanOrder + 0xe) = uVar13;
  }
  (in_task->syntax).data = p->dxva_ctx;
  (in_task->syntax).number = 1;
  in_task->output = p->frame_out->slot_index;
  in_task->valid = 1;
  if (p->eos != 0) {
    (in_task->flags).val = (in_task->flags).val & 0xfffffffffffffffe | (ulong)(p->eos & 1);
  }
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x2a5,"vp8d_ref_update"
              );
  }
  if (p->decMode != 3) {
    ppVVar3 = &p->frame_ref;
    ppVVar4 = &p->frame_golden;
    ppVVar5 = &p->frame_alternate;
    if (p->copyBufferToAlternate == 2) {
      pVVar24 = *ppVVar5;
      ppVVar37 = ppVVar4;
LAB_001b27b3:
      if (pVVar24 != (VP8Frame *)0x0) {
        vp8d_unref_frame(p,pVVar24);
        p->frame_alternate = (VP8Frame *)0x0;
      }
      pVVar24 = *ppVVar37;
      *ppVVar5 = pVVar24;
      vp8d_ref_frame(pVVar24);
    }
    else if (p->copyBufferToAlternate == 1) {
      pVVar24 = *ppVVar5;
      ppVVar37 = ppVVar3;
      goto LAB_001b27b3;
    }
    if (p->copyBufferToGolden == 2) {
      pVVar24 = *ppVVar4;
      ppVVar37 = ppVVar5;
LAB_001b27f3:
      if (pVVar24 != (VP8Frame *)0x0) {
        vp8d_unref_frame(p,pVVar24);
        p->frame_golden = (VP8Frame *)0x0;
      }
      pVVar24 = *ppVVar37;
      *ppVVar4 = pVVar24;
      vp8d_ref_frame(pVVar24);
    }
    else if (p->copyBufferToGolden == 1) {
      pVVar24 = *ppVVar4;
      ppVVar37 = ppVVar3;
      goto LAB_001b27f3;
    }
    if (p->refreshGolden != 0) {
      if (*ppVVar4 != (VP8Frame *)0x0) {
        vp8d_unref_frame(p,*ppVVar4);
        p->frame_golden = (VP8Frame *)0x0;
      }
      p->frame_golden = p->frame_out;
      vp8d_ref_frame(p->frame_out);
    }
    if (p->refreshAlternate != 0) {
      if (*ppVVar5 != (VP8Frame *)0x0) {
        vp8d_unref_frame(p,*ppVVar5);
        p->frame_alternate = (VP8Frame *)0x0;
      }
      p->frame_alternate = p->frame_out;
      vp8d_ref_frame(p->frame_out);
    }
    if (p->refreshLast != 0) {
      if (*ppVVar3 != (VP8Frame *)0x0) {
        vp8d_unref_frame(p,*ppVVar3);
        p->frame_ref = (VP8Frame *)0x0;
      }
      p->frame_ref = p->frame_out;
      vp8d_ref_frame(p->frame_out);
    }
    vp8d_unref_frame(p,p->frame_out);
    p->frame_out = (VP8Frame *)0x0;
  }
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x2e5,
               "vp8d_ref_update");
  }
  if ((vp8d_debug & 0x1000) != 0) {
    if (p->stream_fp == (FILE *)0x0) {
      uVar17 = getpid();
      sprintf(&local_138,"/data/video/mpp_dec_vp8_%d.bin",(ulong)uVar17);
      pFVar26 = fopen(&local_138,"wb");
      p->stream_fp = (FILE *)pFVar26;
    }
    if (p->stream_fp != (FILE *)0x0) {
      if (p->ivf_header_flag == 0) {
        write_ivf_header(p,p->stream_fp);
        p->ivf_header_flag = 1;
      }
      RVar38 = p->stream_size;
      RVar18 = p->frame_cnt;
      local_138 = (char)RVar38;
      local_137 = (undefined1)(RVar38 >> 8);
      local_136 = (undefined1)(RVar38 >> 0x10);
      local_135 = (undefined1)(RVar38 >> 0x18);
      local_134 = (undefined1)RVar18;
      local_133 = (undefined1)(RVar18 >> 8);
      local_132 = (undefined1)(RVar18 >> 0x10);
      local_131 = (undefined1)(RVar18 >> 0x18);
      local_130 = 0;
      fwrite(&local_138,0xc,1,(FILE *)p->stream_fp);
      fwrite(p->bitstream_sw_buf,1,(ulong)p->stream_size,(FILE *)p->stream_fp);
      fflush((FILE *)p->stream_fp);
    }
  }
  p->frame_cnt = p->frame_cnt + 1;
  uVar44 = 0x53f;
  MVar22 = MPP_OK;
LAB_001b29ed:
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",uVar44,
               "vp8d_parser_parse");
  }
  return MVar22;
}

Assistant:

MPP_RET vp8d_parser_parse(void *ctx, HalDecTask *in_task)
{
    MPP_RET ret = MPP_OK;
    VP8DContext *c = (VP8DContext *)ctx;
    VP8DParserContext_t *p = (VP8DParserContext_t *)c->parse_ctx;
    FUN_T("FUN_IN");

    ret = decoder_frame_header(p, p->bitstream_sw_buf, p->stream_size);

    if (MPP_OK != ret) {
        mpp_err("decoder_frame_header err ret %d", ret);
        FUN_T("FUN_OUT");
        return ret;
    }

    vp8hwdSetPartitionOffsets(p, p->bitstream_sw_buf, p->stream_size);

    ret = vp8d_alloc_frame(p);
    if (MPP_OK != ret) {
        mpp_err("vp8d_alloc_frame err ret %d", ret);
        FUN_T("FUN_OUT");
        return ret;
    }

    vp8d_convert_to_syntx(p, in_task);
    /* Rollback entropy probabilities if refresh is not set */
    if (p->refreshEntropyProbs == 0) {
        memcpy((void*)&p->entropy, (void*)&p->entropyLast,
               (unsigned long)sizeof(vp8EntropyProbs_t));
        memcpy((void*)p->vp7ScanOrder, (void*)p->vp7PrevScanOrder,
               (unsigned long)sizeof(p->vp7ScanOrder));
    }
    in_task->syntax.data = (void *)p->dxva_ctx;
    in_task->syntax.number = 1;
    in_task->output = p->frame_out->slot_index;
    in_task->valid = 1;
    if (p->eos) {
        in_task->flags.eos = p->eos;
    }
    vp8d_ref_update(p);

    if (vp8d_debug & VP8D_DBG_DUMP_STREAM) {
        if (!p->stream_fp) {
            char name[256];

            sprintf(name, "/data/video/mpp_dec_vp8_%d.bin", getpid());
            p->stream_fp = fopen(name, "wb");
        }
        if (p->stream_fp) {
            if (!p->ivf_header_flag) {
                write_ivf_header(p, p->stream_fp);
                p->ivf_header_flag = 1;
            }
            write_ivf_frame(p->stream_fp, p->stream_size, p->frame_cnt);
            fwrite(p->bitstream_sw_buf, 1, p->stream_size, p->stream_fp);
            fflush(p->stream_fp);
        }
    }
    p->frame_cnt++;

    FUN_T("FUN_OUT");
    return ret;
}